

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O0

string * __thiscall
kws::Parser::FindMemberFunction(Parser *this,string *buffer,size_t start,size_t end,size_t *pos)

{
  bool bVar1;
  long lVar2;
  Parser *pPVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Parser *in_RCX;
  char *in_RDX;
  string *in_RDI;
  Parser *in_R8;
  ulong *in_R9;
  size_t posf;
  string functionLine;
  size_t index;
  bool inWord;
  size_t close;
  bool inFunction;
  size_t i;
  string line;
  size_t posSemicolon;
  string *functionName;
  char *in_stack_fffffffffffffe08;
  allocator *paVar5;
  int in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  Parser *in_stack_fffffffffffffe38;
  char __lhs;
  allocator *in_stack_fffffffffffffe60;
  Parser *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe98;
  byte bVar6;
  undefined1 uVar7;
  allocator local_141;
  string local_140 [8];
  string *in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed7;
  size_t in_stack_fffffffffffffed8;
  string local_120 [6];
  char in_stack_fffffffffffffee6;
  char in_stack_fffffffffffffee7;
  Parser *in_stack_fffffffffffffee8;
  string local_f8 [32];
  string local_d8 [32];
  Parser *local_b8;
  byte local_ac;
  allocator local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8 [32];
  Parser *local_88;
  byte local_69;
  Parser *local_68;
  int local_5c;
  string local_58 [32];
  Parser *local_38;
  ulong *local_30;
  Parser *local_28;
  Parser *local_20;
  char *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = (Parser *)std::__cxx11::string::find(in_RDX,0x1e54be);
  do {
    uVar7 = local_38 != (Parser *)0xffffffffffffffff && local_38 < local_28;
    if (local_38 == (Parser *)0xffffffffffffffff || local_38 >= local_28) {
      *local_30 = 0xffffffffffffffff;
      paVar5 = &local_141;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",paVar5);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      return in_RDI;
    }
    GetLineNumber(in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30,
                  SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
    GetLine_abi_cxx11_(in_stack_fffffffffffffe68,(unsigned_long)in_stack_fffffffffffffe60);
    lVar2 = std::__cxx11::string::find((char *)local_58,0x1e6620);
    if ((lVar2 == -1) &&
       (lVar2 = std::__cxx11::string::find((char *)local_58,0x1e662c), lVar2 == -1)) {
      local_69 = 1;
      local_68 = local_38;
      do {
        do {
          do {
            local_68 = (Parser *)
                       ((long)&local_68[-1].m_IfElseEndifList.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
            bVar6 = 0;
            if ((local_68 != (Parser *)0xffffffffffffffff) && (bVar6 = 0, local_20 <= local_68)) {
              bVar6 = local_69;
            }
            if ((bVar6 & 1) == 0) goto LAB_001bc3df;
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          } while (*pcVar4 != ')');
          paVar5 = &local_a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"",paVar5);
          pPVar3 = (Parser *)
                   FindClosingChar(in_stack_fffffffffffffee8,in_stack_fffffffffffffee7,
                                   in_stack_fffffffffffffee6,in_stack_fffffffffffffed8,
                                   (bool)in_stack_fffffffffffffed7,in_stack_fffffffffffffec8);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          local_88 = pPVar3;
        } while (pPVar3 == (Parser *)0x0);
        std::__cxx11::string::c_str();
        bVar1 = IsInFunction((Parser *)CONCAT17(uVar7,CONCAT16(bVar6,in_stack_fffffffffffffe98)),
                             (size_t)pcVar4,(char *)paVar5);
        in_stack_fffffffffffffe68 = pPVar3;
      } while (bVar1);
      local_68 = local_88;
      local_69 = 0;
LAB_001bc3df:
      *local_30 = (ulong)((long)&local_68[-1].m_IfElseEndifList.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      if (((*local_30 != 0xffffffffffffffff) && (local_20 < (Parser *)*local_30)) &&
         ((Parser *)*local_30 < local_28)) {
        local_aa = 0;
        in_stack_fffffffffffffe60 = &local_ab;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"",in_stack_fffffffffffffe60);
        std::allocator<char>::~allocator((allocator<char> *)&local_ab);
        local_ac = 0;
        for (local_b8 = (Parser *)*local_30;
            local_b8 != (Parser *)0xffffffffffffffff && local_20 < local_b8;
            local_b8 = (Parser *)
                       ((long)&local_b8[-1].m_IfElseEndifList.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          if ((*pcVar4 == ' ') ||
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar4 == '\t'))
          {
LAB_001bc680:
            if ((local_ac & 1) != 0) break;
          }
          else {
            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::__cxx11::string::operator[]((ulong)local_18);
            __lhs = (char)((ulong)pcVar4 >> 0x38);
            if (((__rhs->_M_dataplus == (_Alloc_hider)0xd) ||
                ((in_stack_fffffffffffffe38 =
                       (Parser *)std::__cxx11::string::operator[]((ulong)local_18),
                 *(char *)&(in_stack_fffffffffffffe38->m_ErrorList).
                           super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                           _M_impl.super__Vector_impl_data._M_start == '\n' ||
                 (in_stack_fffffffffffffe30 =
                       (char *)std::__cxx11::string::operator[]((ulong)local_18),
                 *in_stack_fffffffffffffe30 == '*')))) ||
               (in_stack_fffffffffffffe28 =
                     (char *)std::__cxx11::string::operator[]((ulong)local_18),
               *in_stack_fffffffffffffe28 == '&')) goto LAB_001bc680;
            local_ac = 1;
            std::__cxx11::string::operator[]((ulong)local_18);
            std::operator+(__lhs,__rhs);
            std::__cxx11::string::operator=((string *)in_RDI,local_d8);
            std::__cxx11::string::~string(local_d8);
          }
        }
        GetLineNumber(in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30,
                      SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
        GetLine_abi_cxx11_(in_stack_fffffffffffffe68,(unsigned_long)in_stack_fffffffffffffe60);
        lVar2 = std::__cxx11::string::find((char *)local_f8,0x1e5a2a);
        if ((((lVar2 == -1) &&
             (lVar2 = std::__cxx11::string::find((char *)local_f8,0x1e6620), lVar2 == -1)) &&
            (lVar2 = std::__cxx11::string::find((char *)local_f8,0x1e662c), lVar2 == -1)) &&
           (lVar2 = std::__cxx11::string::find((char *)local_f8,0x1e6636), lVar2 == -1)) {
          lVar2 = std::__cxx11::string::find((char *)in_RDI,0x1e54ca);
          if (lVar2 != -1) {
            std::__cxx11::string::substr((ulong)local_120,(ulong)in_RDI);
            std::__cxx11::string::operator=((string *)in_RDI,local_120);
            std::__cxx11::string::~string(local_120);
          }
          lVar2 = std::__cxx11::string::find((char *)in_RDI,0x1e6615);
          if (lVar2 != -1) {
            std::__cxx11::string::substr((ulong)local_140,(ulong)in_RDI);
            std::__cxx11::string::operator=((string *)in_RDI,local_140);
            std::__cxx11::string::~string(local_140);
          }
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  in_stack_fffffffffffffe08);
          in_stack_fffffffffffffe14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe14);
          if (!bVar1) goto LAB_001bc8b4;
          local_aa = 1;
          local_5c = 1;
        }
        else {
LAB_001bc8b4:
          local_5c = 0;
        }
        std::__cxx11::string::~string(local_f8);
        if ((local_aa & 1) == 0) {
          std::__cxx11::string::~string((string *)in_RDI);
        }
        if (local_5c != 0) goto LAB_001bc934;
      }
      local_38 = (Parser *)std::__cxx11::string::find(local_18,0x1e54be);
      local_5c = 0;
    }
    else {
      local_38 = (Parser *)std::__cxx11::string::find(local_18,0x1e54be);
      local_5c = 2;
    }
LAB_001bc934:
    std::__cxx11::string::~string(local_58);
    in_stack_fffffffffffffe10 = local_5c;
    if ((local_5c != 0) && (local_5c == 1)) {
      return in_RDI;
    }
  } while( true );
}

Assistant:

std::string Parser::FindMemberFunction(std::string & buffer, size_t start, size_t end,size_t& pos)
{
  size_t posSemicolon = buffer.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We check that we don't have the keyword __attribute__
    std::string line = this->GetLine(this->GetLineNumber(posSemicolon,true)-1);
    if((line.find("_attribute_") != std::string::npos)
      || (line.find(" operator") != std::string::npos)
      )
      {
      posSemicolon = buffer.find(";",posSemicolon+1);
      continue;
      }

    // We try to find a (
    size_t i=posSemicolon-1;
    bool inFunction = true;
    while(i != std::string::npos && i>=start && inFunction)
      {
      if(buffer[i] == ')')
        {
        size_t close = this->FindClosingChar(')','(',i,true);
        if(close>0 && !this->IsInFunction(close,buffer.c_str()))
          {
          i = close;
          inFunction = false;
          break;
          }
        }
      i--;
      }

    pos = i-1;

    // If we have a match we extract the word
    if(pos != std::string::npos && pos>start && pos<end)
      {
      std::string functionName = "";
      bool inWord = false;
      size_t index=pos;
      for(;index!=std::string::npos && index>start;index--)
        {
        if(buffer[index] != ' ' && buffer[index] != '\t'
           && buffer[index] != '\r' && buffer[index] != '\n' && buffer[index] != '*' && buffer[index] != '&')
          {
          inWord = true;
          functionName = buffer[index]+functionName;
          }
        else if(inWord)
          {
          break;
          }
        }
      // Check that this is not a #define (tricky)
      std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);
      if(functionLine.find("#define") == std::string::npos
         && functionLine.find("_attribute_") == std::string::npos
         && functionLine.find(" operator") == std::string::npos
         && functionLine.find("friend ") == std::string::npos)
        {
        // If we have a class definition: Test():Base
        // we return the correct
        size_t posf = functionName.find("(",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }
        posf = functionName.find(":",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }

        // If the function name is void we skip because it means
        // this is a member variable function (see bug 5086)
        if(functionName != "void")
          {
          return functionName;
          }
        }
      }
    posSemicolon = buffer.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}